

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> * __thiscall
FillableSigningProvider::GetKeys(FillableSigningProvider *this)

{
  long lVar1;
  bool bVar2;
  char *in_RSI;
  set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CKeyID>,_bool> pVar3;
  pair<const_CKeyID,_CKey> *mi;
  KeyMap *__range1;
  set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *set_address;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *in_stack_ffffffffffffff58;
  map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *pszFile;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RSI,(char *)pszFile,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_>::set(in_stack_ffffffffffffff58);
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::begin
            (in_stack_ffffffffffffff60);
  std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::end
            (in_stack_ffffffffffffff60);
  while (bVar2 = std::operator==((_Self *)CONCAT17(in_stack_ffffffffffffff6f,
                                                   in_stack_ffffffffffffff68),
                                 (_Self *)in_stack_ffffffffffffff60), ((bVar2 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_> *)in_stack_ffffffffffffff58)
    ;
    pVar3 = std::set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_>::insert
                      ((set<CKeyID,_std::less<CKeyID>,_std::allocator<CKeyID>_> *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                       (value_type *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff6f = pVar3.second;
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_> *)in_stack_ffffffffffffff58)
    ;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::set<CKeyID> FillableSigningProvider::GetKeys() const
{
    LOCK(cs_KeyStore);
    std::set<CKeyID> set_address;
    for (const auto& mi : mapKeys) {
        set_address.insert(mi.first);
    }
    return set_address;
}